

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O1

void __thiscall icu_63::RBBINode::RBBINode(RBBINode *this,NodeType t)

{
  uint in_EAX;
  UVector *pUVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  UErrorCode *status_00;
  UErrorCode status;
  undefined8 uStack_28;
  
  status_00 = (UErrorCode *)CONCAT44(in_register_00000034,t);
  (this->fText).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->fText).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fType = t;
  this->fParent = (RBBINode *)0x0;
  this->fLeftChild = (RBBINode *)0x0;
  this->fRightChild = (RBBINode *)0x0;
  this->fInputSet = (UnicodeSet *)0x0;
  this->fPrecedence = precZero;
  this->fFirstPos = 0;
  this->fLastPos = 0;
  this->fNullable = '\0';
  this->fVal = 0;
  *(undefined4 *)((long)&this->fVal + 3) = 0;
  uStack_28 = (ulong)in_EAX;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    status_00 = (UErrorCode *)((long)&uStack_28 + 4);
    UVector::UVector(pUVar1,status_00);
  }
  this->fFirstPosSet = pUVar1;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    status_00 = (UErrorCode *)((long)&uStack_28 + 4);
    UVector::UVector(pUVar1,status_00);
  }
  this->fLastPosSet = pUVar1;
  pUVar1 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status_00);
  if (pUVar1 == (UVector *)0x0) {
    pUVar1 = (UVector *)0x0;
  }
  else {
    UVector::UVector(pUVar1,(UErrorCode *)((long)&uStack_28 + 4));
  }
  this->fFollowPos = pUVar1;
  uVar2 = t - opStart;
  if ((uVar2 < 9) && ((0x107U >> (uVar2 & 0x1f) & 1) != 0)) {
    this->fPrecedence = *(OpPrecedence *)(&DAT_0037fae0 + (ulong)uVar2 * 4);
  }
  return;
}

Assistant:

RBBINode::RBBINode(NodeType t) : UMemory() {
#ifdef RBBI_DEBUG
    fSerialNum    = ++gLastSerial;
#endif
    fType         = t;
    fParent       = NULL;
    fLeftChild    = NULL;
    fRightChild   = NULL;
    fInputSet     = NULL;
    fFirstPos     = 0;
    fLastPos      = 0;
    fNullable     = FALSE;
    fLookAheadEnd = FALSE;
    fRuleRoot     = FALSE;
    fChainIn      = FALSE;
    fVal          = 0;
    fPrecedence   = precZero;

    UErrorCode     status = U_ZERO_ERROR;
    fFirstPosSet  = new UVector(status);  // TODO - get a real status from somewhere
    fLastPosSet   = new UVector(status);
    fFollowPos    = new UVector(status);
    if      (t==opCat)    {fPrecedence = precOpCat;}
    else if (t==opOr)     {fPrecedence = precOpOr;}
    else if (t==opStart)  {fPrecedence = precStart;}
    else if (t==opLParen) {fPrecedence = precLParen;}

}